

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul-lace.c
# Opt level: O2

double maxerror(float *A,float *B,int n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  dVar4 = 0.0;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar3 = 0; (uint)n != uVar3; uVar3 = uVar3 + 1) {
      fVar6 = (A[uVar3] - B[uVar3]) / A[uVar3];
      dVar5 = (double)fVar6;
      if (fVar6 < 0.0) {
        dVar5 = -dVar5;
      }
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = dVar5;
    }
    A = A + n;
    B = B + n;
  }
  return dVar4;
}

Assistant:

double maxerror(REAL *A, REAL *B, int n)
{
    int i, j;
    double error = 0.0;

    for (i = 0; i < n; i++) {
        for (j = 0; j < n; j++) {
            double diff = (A[i * n + j] - B[i * n + j]) / A[i * n + j];
            if (diff < 0)
                diff = -diff;
            if (diff > error)
                error = diff;
        }
    }
    return error;
}